

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hpp
# Opt level: O1

void __thiscall pearce::ThreadPool::ThreadPool(ThreadPool *this,uint32_t numThreads)

{
  ThreadPool *local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->m_done)._M_base._M_i = false;
  memset(&this->m_workQueue,0,0xb0);
  (this->m_workQueue).m_valid._M_base._M_i = true;
  (this->m_workQueue).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_workQueue).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_workQueue).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_workQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_workQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_workQueue).m_queue.c.
  super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_workQueue).m_queue.c.
  super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_workQueue).m_queue.c.
  super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->m_workQueue).m_queue.c.
  super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_workQueue).m_queue.c.
           super__Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>,_std::allocator<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>_>
                       *)&(this->m_workQueue).m_queue,0);
  std::condition_variable::condition_variable(&(this->m_workQueue).m_condition);
  (this->m_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (numThreads != 0) {
    do {
      local_40 = worker;
      local_38 = 0;
      local_48 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(pearce::ThreadPool::*)(),pearce::ThreadPool*>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->m_threads,
                 (offset_in_ThreadPool_to_subr *)&local_40,&local_48);
      numThreads = numThreads - 1;
    } while (numThreads != 0);
  }
  return;
}

Assistant:

explicit ThreadPool(const std::uint32_t numThreads)
        : m_done{false}
        , m_workQueue{}
        , m_threads{}
    {
        try {
            for (std::uint32_t i = 0u; i < numThreads; ++i) {
                m_threads.emplace_back(&ThreadPool::worker, this);
            }
        }
        catch (...) {
            destroy();
            throw;
        }
    }